

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
duckdb::BaseScalarFunction::BaseScalarFunction
          (BaseScalarFunction *this,string *name_p,vector<duckdb::LogicalType,_true> *arguments_p,
          LogicalType *return_type_p,FunctionStability stability,LogicalType *varargs_p,
          FunctionNullHandling null_handling,FunctionErrors errors)

{
  LogicalType *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined1 in_R8B;
  undefined1 in_stack_00000008;
  undefined1 in_stack_00000010;
  LogicalType *in_stack_ffffffffffffff58;
  LogicalType *in_stack_ffffffffffffff88;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  SimpleFunction *in_stack_ffffffffffffffa0;
  string local_50 [47];
  undefined1 local_21;
  
  local_21 = in_R8B;
  ::std::__cxx11::string::string(local_50,in_RSI);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_RDX,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff58);
  LogicalType::LogicalType(in_RDX,in_stack_ffffffffffffff58);
  SimpleFunction::SimpleFunction
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  LogicalType::~LogicalType((LogicalType *)0x2a5458d);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2a54597);
  ::std::__cxx11::string::~string(local_50);
  *in_RDI = &PTR__BaseScalarFunction_05cd1a90;
  LogicalType::LogicalType(in_RDX,in_stack_ffffffffffffff58);
  *(undefined1 *)(in_RDI + 0x15) = local_21;
  *(undefined1 *)((long)in_RDI + 0xa9) = in_stack_00000008;
  *(undefined1 *)((long)in_RDI + 0xaa) = in_stack_00000010;
  *(undefined1 *)((long)in_RDI + 0xab) = 0;
  return;
}

Assistant:

BaseScalarFunction::BaseScalarFunction(string name_p, vector<LogicalType> arguments_p, LogicalType return_type_p,
                                       FunctionStability stability, LogicalType varargs_p,
                                       FunctionNullHandling null_handling, FunctionErrors errors)
    : SimpleFunction(std::move(name_p), std::move(arguments_p), std::move(varargs_p)),
      return_type(std::move(return_type_p)), stability(stability), null_handling(null_handling), errors(errors),
      collation_handling(FunctionCollationHandling::PROPAGATE_COLLATIONS) {
}